

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void __thiscall NukedOPL3::WriteReg(NukedOPL3 *this,int reg,int v)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  byte data;
  short sVar6;
  opl_channel *poVar7;
  opl_slot *slot;
  
  uVar5 = (uint)reg >> 4 & 0xf;
  if (uVar5 < 0x10) {
    uVar2 = (uint)reg >> 8;
    data = (byte)v;
    switch(uVar5) {
    case 0:
      uVar5 = reg & 0xf;
      if ((uVar2 & 1) == 0) {
        if (uVar5 == 8) {
          (this->opl3).nts = data >> 6 & 1;
        }
      }
      else if (uVar5 == 5) {
        (this->opl3).newm = data & 1;
      }
      else if (uVar5 == 4) {
        chan_set4op(&this->opl3,data);
        return;
      }
      break;
    case 2:
    case 3:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar5 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar2 & 1) == 0) {
          uVar5 = (int)""[reg & 0x1fU];
        }
        slot = (this->opl3).slot + uVar5;
        (this->opl3).slot[uVar5].trem =
             (Bit8u *)(((this->opl3).slot[uVar5].chip)->mixbuff + (ulong)(-1 < (char)data) * 2 + -3)
        ;
        (this->opl3).slot[uVar5].reg_vib = (byte)((uint)v >> 6) & 1;
        (this->opl3).slot[uVar5].reg_type = (byte)((uint)v >> 5) & 1;
        (this->opl3).slot[uVar5].reg_ksr = (byte)((uint)v >> 4) & 1;
        (this->opl3).slot[uVar5].reg_mult = data & 0xf;
LAB_00325b50:
        envelope_update_rate(slot);
        return;
      }
      break;
    case 4:
    case 5:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar5 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar2 & 1) == 0) {
          uVar5 = (int)""[reg & 0x1fU];
        }
        (this->opl3).slot[uVar5].reg_ksl = (byte)((uint)v >> 6) & 3;
        (this->opl3).slot[uVar5].reg_tl = data & 0x3f;
        poVar7 = (this->opl3).slot[uVar5].channel;
        sVar4 = (ushort)poVar7->block * 0x20 + (ushort)""[poVar7->f_num >> 6] * 4 + -0x100;
        sVar6 = 0;
        if (0 < sVar4) {
          sVar6 = sVar4;
        }
        (this->opl3).slot[uVar5].eg_ksl = (Bit8u)sVar6;
      }
      break;
    case 6:
    case 7:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar5 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar2 & 1) == 0) {
          uVar5 = (int)""[reg & 0x1fU];
        }
        slot = (this->opl3).slot + uVar5;
        (this->opl3).slot[uVar5].reg_ar = (byte)((uint)v >> 4) & 0xf;
        (this->opl3).slot[uVar5].reg_dr = data & 0xf;
        goto LAB_00325b50;
      }
      break;
    case 8:
    case 9:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar5 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar2 & 1) == 0) {
          uVar5 = (int)""[reg & 0x1fU];
        }
        slot = (this->opl3).slot + uVar5;
        bVar1 = (byte)((uint)v >> 4) & 0xf;
        bVar3 = 0x1f;
        if (bVar1 != 0xf) {
          bVar3 = bVar1;
        }
        (this->opl3).slot[uVar5].reg_sl = bVar3;
        (this->opl3).slot[uVar5].reg_rr = data & 0xf;
        goto LAB_00325b50;
      }
      break;
    case 10:
      if ((reg & 0xfU) < 9) {
        chan_writea0((this->opl3).channel + ((uVar2 & 1) * 9 + (reg & 0xfU)),data);
        return;
      }
      break;
    case 0xb:
      if ((char)reg == -0x43 && (reg & 0x100U) == 0) {
        (this->opl3).dam = (byte)((uint)v >> 7) & 1;
        (this->opl3).dvb = data >> 6 & 1;
        chan_updaterhythm(&this->opl3,data);
        return;
      }
      if ((reg & 0xfU) < 9) {
        poVar7 = (this->opl3).channel + ((uVar2 & 1) * 9 + (reg & 0xfU));
        chan_writeb0(poVar7,data);
        if ((v & 0x20U) == 0) {
          chan_disable(poVar7);
          return;
        }
        chan_enable(poVar7);
        return;
      }
      break;
    case 0xc:
      if ((reg & 0xfU) < 9) {
        chan_writec0((this->opl3).channel + ((uVar2 & 1) * 9 + (reg & 0xfU)),data);
        return;
      }
      break;
    case 0xe:
    case 0xf:
      if ((0x3f3f3fU >> (reg & 0x1fU) & 1) != 0) {
        uVar5 = (int)""[reg & 0x1fU] + 0x12;
        if ((uVar2 & 1) == 0) {
          uVar5 = (int)""[reg & 0x1fU];
        }
        (this->opl3).slot[uVar5].reg_wf = data & 7;
        if (((this->opl3).slot[uVar5].chip)->newm == '\0') {
          (this->opl3).slot[uVar5].reg_wf = data & 3;
        }
      }
    }
  }
  return;
}

Assistant:

void NukedOPL3::WriteReg(int reg, int v) {
	v &= 0xff;
	reg &= 0x1ff;
	Bit8u high = (reg >> 8) & 0x01;
	Bit8u regm = reg & 0xff;
	switch (regm & 0xf0) {
	case 0x00:
		if (high) {
			switch (regm & 0x0f) {
			case 0x04:
				chan_set4op(&opl3, v);
				break;
			case 0x05:
				opl3.newm = v & 0x01;
				break;
			}
		}
		else {
			switch (regm & 0x0f) {
			case 0x08:
				opl3.nts = (v >> 6) & 0x01;
				break;
			}
		}
		break;
	case 0x20:
	case 0x30:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write20(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x40:
	case 0x50:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write40(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x60:
	case 0x70:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write60(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0x80:
	case 0x90:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_write80(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);;
		}
		break;
	case 0xe0:
	case 0xf0:
		if (ad_slot[regm & 0x1f] >= 0) {
			slot_writee0(&opl3.slot[18 * high + ad_slot[regm & 0x1f]], v);
		}
		break;
	case 0xa0:
		if ((regm & 0x0f) < 9) {
			chan_writea0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	case 0xb0:
		if (regm == 0xbd && !high) {
			opl3.dam = v >> 7;
			opl3.dvb = (v >> 6) & 0x01;
			chan_updaterhythm(&opl3, v);
		}
		else if ((regm & 0x0f) < 9) {
			chan_writeb0(&opl3.channel[9 * high + (regm & 0x0f)], v);
			if (v & 0x20) {
				chan_enable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
			else {
				chan_disable(&opl3.channel[9 * high + (regm & 0x0f)]);
			}
		}
		break;
	case 0xc0:
		if ((regm & 0x0f) < 9) {
			chan_writec0(&opl3.channel[9 * high + (regm & 0x0f)], v);
		}
		break;
	}
}